

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_simple_wait_frame_on_channel
              (amqp_connection_state_t state,amqp_channel_t channel,amqp_frame_t *decoded_frame)

{
  undefined8 *puVar1;
  amqp_link_t_ *paVar2;
  undefined8 uVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  amqp_link_t *paVar9;
  
  paVar9 = (amqp_link_t *)&state->first_queued_frame;
  do {
    paVar9 = paVar9->next;
    if (paVar9 == (amqp_link_t *)0x0) {
      while( true ) {
        iVar8 = wait_frame_inner(state,decoded_frame,(timeval *)0x0);
        if (iVar8 != 0) {
          return iVar8;
        }
        if (decoded_frame->channel == channel) break;
        iVar8 = amqp_queue_frame(state,decoded_frame);
        if (iVar8 != 0) {
          return -1;
        }
      }
      return 0;
    }
    puVar1 = (undefined8 *)paVar9->data;
  } while (*(amqp_channel_t *)((long)puVar1 + 2) != channel);
  paVar2 = paVar9->next;
  state->first_queued_frame = paVar2;
  if (paVar2 == (amqp_link_t_ *)0x0) {
    state->last_queued_frame = (amqp_link_t *)0x0;
  }
  uVar3 = *puVar1;
  sVar4 = puVar1[1];
  pvVar5 = (void *)puVar1[2];
  pvVar6 = (void *)puVar1[3];
  pvVar7 = (void *)puVar1[5];
  (decoded_frame->payload).properties.raw.len = puVar1[4];
  (decoded_frame->payload).properties.raw.bytes = pvVar7;
  (decoded_frame->payload).method.decoded = pvVar5;
  (decoded_frame->payload).properties.decoded = pvVar6;
  decoded_frame->frame_type = (char)uVar3;
  decoded_frame->field_0x1 = (char)((ulong)uVar3 >> 8);
  decoded_frame->channel = (short)((ulong)uVar3 >> 0x10);
  *(int *)&decoded_frame->field_0x4 = (int)((ulong)uVar3 >> 0x20);
  (decoded_frame->payload).body_fragment.len = sVar4;
  return 0;
}

Assistant:

int amqp_simple_wait_frame_on_channel(amqp_connection_state_t state,
                                      amqp_channel_t channel,
                                      amqp_frame_t *decoded_frame)
{
  amqp_frame_t *frame_ptr;
  amqp_link_t *cur;
  int res;

  for (cur = state->first_queued_frame; NULL != cur; cur = cur->next) {
    frame_ptr = cur->data;

    if (channel == frame_ptr->channel) {
      state->first_queued_frame = cur->next;
      if (NULL == state->first_queued_frame) {
        state->last_queued_frame = NULL;
      }

      *decoded_frame = *frame_ptr;

      return AMQP_STATUS_OK;
    }
  }

  while (1) {
    res = wait_frame_inner(state, decoded_frame, NULL);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (channel == decoded_frame->channel) {
      return AMQP_STATUS_OK;
    } else {
      res = amqp_queue_frame(state, decoded_frame);
      if (res != AMQP_STATUS_OK) {
        return res;
      }
    }
  }
}